

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::PathTypeHandlerBase::VerifyInlineSlotCapacityIsLocked
          (PathTypeHandlerBase *this,bool startFromRoot)

{
  PathTypeSuccessorInfo *pPVar1;
  long lVar2;
  DynamicTypeHandler *pDVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  DynamicType *pDVar8;
  undefined4 *puVar9;
  PathTypeHandlerBase *this_00;
  long lVar10;
  ulong uVar11;
  
LAB_00dd32f4:
  if ((startFromRoot & 1U) != 0) goto code_r0x00dd32fa;
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xa33,"(GetIsInlineSlotCapacityLocked())",
                                "GetIsInlineSlotCapacityLocked()");
    if (!bVar5) goto LAB_00dd34cd;
    *puVar9 = 0;
  }
  pPVar1 = (this->successorInfo).ptr;
  if (pPVar1 != (PathTypeSuccessorInfo *)0x0) {
    if (pPVar1->kind == PathTypeSuccessorKindSingle) {
      if ((*(long **)(pPVar1 + 0x10) != (long *)0x0) &&
         (lVar2 = **(long **)(pPVar1 + 0x10), lVar2 != 0)) {
        pDVar3 = *(DynamicTypeHandler **)(lVar2 + 0x28);
        iVar6 = (*pDVar3->_vptr_DynamicTypeHandler[0x4e])(pDVar3);
        if (iVar6 == 0) {
          (*pDVar3->_vptr_DynamicTypeHandler[0x40])(pDVar3);
          return;
        }
        this = FromTypeHandler(pDVar3);
        goto LAB_00dd33c5;
      }
    }
    else {
      if (*(long *)(pPVar1 + 8) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xdf,"(this->propertySuccessors)","this->propertySuccessors");
        if (!bVar5) {
LAB_00dd34cd:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
      }
      lVar2 = *(long *)(pPVar1 + 8);
      if (*(int *)(lVar2 + 0x24) != 0) {
        uVar11 = 0;
        do {
          iVar6 = *(int *)(*(long *)(lVar2 + 8) + uVar11 * 4);
          while (iVar6 != -1) {
            lVar10 = (long)iVar6;
            iVar6 = *(int *)(*(long *)(lVar2 + 0x10) + 8 + lVar10 * 0x18);
            lVar10 = **(long **)(*(long *)(lVar2 + 0x10) + lVar10 * 0x18);
            if (lVar10 != 0) {
              pDVar3 = *(DynamicTypeHandler **)(lVar10 + 0x28);
              iVar7 = (*pDVar3->_vptr_DynamicTypeHandler[0x4e])(pDVar3);
              if (iVar7 == 0) {
                (*pDVar3->_vptr_DynamicTypeHandler[0x40])(pDVar3);
              }
              else {
                this_00 = FromTypeHandler(pDVar3);
                VerifyInlineSlotCapacityIsLocked(this_00,false);
              }
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < *(uint *)(lVar2 + 0x24));
      }
    }
  }
  return;
code_r0x00dd32fa:
  pDVar8 = (this->predecessorType).ptr;
  startFromRoot = false;
  if (pDVar8 != (DynamicType *)0x0) {
    do {
      this = FromTypeHandler((pDVar8->typeHandler).ptr);
      pDVar8 = (this->predecessorType).ptr;
    } while (pDVar8 != (DynamicType *)0x0);
LAB_00dd33c5:
    startFromRoot = false;
  }
  goto LAB_00dd32f4;
}

Assistant:

void PathTypeHandlerBase::VerifyInlineSlotCapacityIsLocked(bool startFromRoot)
    {
        if (startFromRoot)
        {
            GetRootPathTypeHandler()->VerifyInlineSlotCapacityIsLocked(false);
            return;
        }

        Assert(!startFromRoot);

        Assert(GetIsInlineSlotCapacityLocked());

        this->MapSuccessors([](const PathTypeSuccessorKey, RecyclerWeakReference<DynamicType> * typeWeakReference)
        {
            DynamicType * type = typeWeakReference->Get();
            if (!type)
            {
                return;
            }

            DynamicTypeHandler* successorTypeHandler = type->GetTypeHandler();
            successorTypeHandler->IsPathTypeHandler() ?
                PathTypeHandlerBase::FromTypeHandler(successorTypeHandler)->VerifyInlineSlotCapacityIsLocked(false) :
                successorTypeHandler->VerifyInlineSlotCapacityIsLocked();
        });
    }